

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.h
# Opt level: O0

void __thiscall Delay::Delay(Delay *this,unsigned_long _ms)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar1;
  rep_conflict rVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  duration<double,_std::ratio<1L,_1L>_> local_50;
  duration<double,_std::ratio<1L,_1L>_> duration;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_30;
  time_point *time;
  unsigned_long local_18;
  unsigned_long _ms_local;
  Delay *this_local;
  
  local_18 = _ms;
  _ms_local = (unsigned_long)this;
  Promise::Promise(&this->super_Promise);
  (this->super_Promise)._vptr_Promise = (_func_int **)&PTR_Tick_00117d00;
  this->ms = local_18;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->target_time);
  local_38.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_30 = &local_38;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
            ((duration<long,std::ratio<1l,1000l>> *)&duration,&this->ms);
  tVar1 = std::chrono::operator+(&local_38,(duration<long,_std::ratio<1L,_1000L>_> *)&duration);
  (this->target_time).__d.__r = (rep)tVar1.__d.__r;
  local_58.__r = (rep)std::chrono::operator-(&this->target_time,local_30);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_50,&local_58);
  timestamp();
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_50);
  printf("Time diff: %f\n",rVar2);
  return;
}

Assistant:

explicit Delay(unsigned long _ms): ms(_ms), Promise() {
    const time_point& time = std::chrono::system_clock::now();
    target_time = time + std::chrono::milliseconds(ms);
    std::chrono::duration<double> duration = target_time - time;
    timestamp(); printf("Time diff: %f\n", duration.count());
  }